

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
::Init(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
       *this)

{
  Arena *this_00;
  InnerMap *elem;
  
  this_00 = this->arena_;
  if (this_00 == (Arena *)0x0) {
    elem = (InnerMap *)operator_new(0x30);
    InnerMap::InnerMap(elem,0,0);
  }
  else {
    elem = (InnerMap *)
           Arena::AllocateAligned
                     (this_00,(type_info *)
                              &Map<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>
                               ::InnerMap::typeinfo,0x30);
    InnerMap::InnerMap(elem,0,this_00);
    Arena::AddListNode(this_00,elem,
                       internal::
                       arena_destruct_object<google::protobuf::Map<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap>
                      );
  }
  this->elements_ = elem;
  return;
}

Assistant:

void Init() {
    elements_ = Arena::Create<InnerMap>(arena_, 0, hasher(), Allocator(arena_));
  }